

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracer-real-time.cpp
# Opt level: O2

void __thiscall dynamicgraph::TracerRealTime::closeFiles(TracerRealTime *this)

{
  undefined1 *this_00;
  long *plVar1;
  long *plVar2;
  _List_node_base *p_Var3;
  long *plVar4;
  
  std::mutex::lock((mutex *)&this->field_0xf0);
  this_00 = &this->field_0x190;
  p_Var3 = (_List_node_base *)&this->hardFiles;
  plVar4 = (long *)this_00;
  while (plVar4 = (long *)*plVar4, (long *)this_00 != plVar4) {
    p_Var3 = (((_List_base<std::basic_ofstream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_*>_>
                *)&p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (plVar4[2] == 0) {
      plVar2 = (long *)0x0;
    }
    else {
      plVar2 = (long *)__dynamic_cast(plVar4[2],&std::ostream::typeinfo,
                                      &std::__cxx11::stringstream::typeinfo,0x10);
    }
    plVar1 = (long *)p_Var3[1]._M_next;
    std::ostream::flush();
    std::ofstream::close();
    if (plVar2 != (long *)0x0) {
      (**(code **)(*plVar2 + 8))(plVar2);
    }
    (**(code **)(*plVar1 + 8))(plVar1);
  }
  std::__cxx11::
  list<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ::clear((list<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
           *)this_00);
  std::__cxx11::
  list<std::basic_ofstream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_*>_>
  ::clear(&this->hardFiles);
  pthread_mutex_unlock((pthread_mutex_t *)&this->field_0xf0);
  return;
}

Assistant:

void TracerRealTime::closeFiles() {
  dgDEBUGIN(15);
  std::lock_guard<std::mutex> files_lock(files_mtx);

  FileList::iterator iter = files.begin();
  HardFileList::iterator hardIter = hardFiles.begin();

  while (files.end() != iter) {
    dgDEBUG(25) << "Close the files." << endl;

    std::stringstream *file = dynamic_cast<stringstream *>(*iter);
    std::ofstream *hardFile = *hardIter;

    (*hardFile) << flush;
    hardFile->close();
    delete file;
    delete hardFile;

    ++iter;
    ++hardIter;
  }

  dgDEBUG(25) << "Clear the lists." << endl;
  files.clear();
  hardFiles.clear();

  dgDEBUGOUT(15);
}